

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

void __thiscall kj::anon_unknown_77::AsyncTee::~AsyncTee(AsyncTee *this)

{
  PromiseNode *pPVar1;
  Disposer *pDVar2;
  AsyncInputStream *pAVar3;
  byte bVar4;
  long lVar5;
  byte bVar6;
  Fault f;
  Fault local_28;
  
  lVar5 = 0x38;
  bVar6 = 0;
  do {
    bVar4 = bVar6 & 1;
    bVar6 = 1;
    if (bVar4 == 0) {
      bVar6 = *(byte *)((long)this->branches + lVar5 + -0x38);
    }
    lVar5 = lVar5 + 0x60;
  } while (lVar5 != 0xf8);
  if (bVar6 != 0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x4ba,FAILED,"!hasBranches","\"destroying AsyncTee with branch still alive\"",
               (char (*) [44])"destroying AsyncTee with branch still alive");
    _::Debug::Fault::~Fault(&local_28);
  }
  pPVar1 = (this->pullPromise).super_PromiseBase.node.ptr;
  if (pPVar1 != (PromiseNode *)0x0) {
    (this->pullPromise).super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    pDVar2 = (this->pullPromise).super_PromiseBase.node.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  if ((this->stoppage).ptr.isSet == true) {
    if ((this->stoppage).ptr.field_1.value.tag == 1) {
      (this->stoppage).ptr.field_1.value.tag = 0;
    }
    if ((this->stoppage).ptr.field_1.value.tag == 2) {
      (this->stoppage).ptr.field_1.value.tag = 0;
      Exception::~Exception((Exception *)&(this->stoppage).ptr.field_1.value.field_1);
    }
  }
  lVar5 = 0;
  do {
    if ((&this->branches[1].ptr.isSet)[lVar5] == true) {
      std::deque<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>::~deque
                ((deque<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_> *)
                 ((long)&this->branches[1].ptr.field_1 + lVar5));
    }
    lVar5 = lVar5 + -0x60;
  } while (lVar5 != -0xc0);
  pAVar3 = (this->inner).ptr;
  if (pAVar3 != (AsyncInputStream *)0x0) {
    (this->inner).ptr = (AsyncInputStream *)0x0;
    pDVar2 = (this->inner).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pAVar3->_vptr_AsyncInputStream[-2] + (long)&pAVar3->_vptr_AsyncInputStream);
  }
  Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~AsyncTee() noexcept(false) {
    bool hasBranches = false;
    for (auto& branch: branches) {
      hasBranches = hasBranches || branch != nullptr;
    }
    KJ_ASSERT(!hasBranches, "destroying AsyncTee with branch still alive") {
      // Don't std::terminate().
      break;
    }
  }